

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
* testing::internal::edit_distance::CalculateOptimalEdits
            (vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             *__return_storage_ptr__,vector<unsigned_long,_std::allocator<unsigned_long>_> *left,
            vector<unsigned_long,_std::allocator<unsigned_long>_> *right)

{
  undefined8 *puVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  pointer puVar5;
  pointer puVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer puVar9;
  undefined1 auVar10 [16];
  long lVar11;
  EditType EVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  size_t r_i_1;
  long lVar16;
  size_t l_i_1;
  undefined1 auVar17 [16];
  undefined1 in_ZMM1 [64];
  allocator_type local_82;
  allocator_type local_81;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_80;
  vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
  best_move;
  EditType move;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  costs;
  
  auVar17 = in_ZMM1._0_16_;
  puVar5 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_80 = right;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&best_move,
             ((long)(right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) + 1,(allocator_type *)&move);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&costs,((long)puVar6 - (long)puVar5 >> 3) + 1,(value_type *)&best_move,&local_82);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&best_move);
  puVar5 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  std::
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  ::vector((vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
            *)&move,((long)(local_80->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(local_80->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 3) + 1,
           (allocator_type *)&local_82);
  std::
  vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
  ::vector(&best_move,((long)puVar6 - (long)puVar5 >> 3) + 1,(value_type *)&move,&local_81);
  std::
  _Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  ::~_Vector_base((_Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                   *)&move);
  lVar11 = 0;
  for (lVar14 = 0;
      ((long)costs.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
      (long)costs.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) / 0x18 != lVar14; lVar14 = lVar14 + 1) {
    auVar10 = vcvtusi2sd_avx512f(auVar17,lVar14);
    **(undefined8 **)
      ((long)&((costs.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
              _M_start + lVar11) = auVar10._0_8_;
    puVar1 = (undefined8 *)
             ((long)&((best_move.
                       super__Vector_base<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                     )._M_impl.super__Vector_impl_data._M_start + lVar11);
    lVar11 = lVar11 + 0x18;
    *(undefined4 *)*puVar1 = 2;
  }
  pdVar7 = ((costs.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar8 = ((costs.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (uVar13 = 1; uVar13 < (ulong)((long)pdVar8 - (long)pdVar7 >> 3); uVar13 = uVar13 + 1) {
    auVar10 = vcvtusi2sd_avx512f(auVar17,uVar13);
    pdVar7[uVar13] = auVar10._0_8_;
    ((best_move.
      super__Vector_base<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->
    super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
    )._M_impl.super__Vector_impl_data._M_start[uVar13] = kAdd;
  }
  puVar5 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (local_80->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar9 = (local_80->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar14 = (long)(left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)puVar5 >> 3;
  lVar11 = 0;
  while (lVar15 = lVar11, lVar15 != lVar14) {
    for (lVar16 = 0; lVar11 = lVar15 + 1, (long)puVar9 - (long)puVar6 >> 3 != lVar16;
        lVar16 = lVar16 + 1) {
      if (puVar5[lVar15] == puVar6[lVar16]) {
        costs.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar15 + 1].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar16 + 1] = costs.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar15].
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar16];
        EVar12 = kMatch;
      }
      else {
        pdVar7 = costs.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar15].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar8 = costs.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar15 + 1].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        dVar2 = pdVar8[lVar16];
        dVar3 = pdVar7[lVar16 + 1];
        dVar4 = pdVar7[lVar16];
        if ((dVar3 <= dVar2) || (dVar4 <= dVar2)) {
          if ((dVar2 <= dVar3) || (dVar4 <= dVar3)) {
            pdVar8[lVar16 + 1] = dVar4 + 1.00001;
            EVar12 = kReplace;
          }
          else {
            pdVar8[lVar16 + 1] = dVar3 + 1.0;
            EVar12 = kRemove;
          }
        }
        else {
          pdVar8[lVar16 + 1] = dVar2 + 1.0;
          EVar12 = kAdd;
        }
      }
      best_move.
      super__Vector_base<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar15 + 1].
      super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar16 + 1] = EVar12;
    }
  }
  (__return_storage_ptr__->
  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar11 = (long)(local_80->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(local_80->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start >> 3;
  for (; lVar14 != 0 || lVar11 != 0; lVar14 = lVar14 - (ulong)(move != kAdd)) {
    move = best_move.
           super__Vector_base<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar14].
           super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar11];
    std::
    vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
    ::push_back(__return_storage_ptr__,&move);
    lVar11 = lVar11 - (ulong)(move != kRemove);
  }
  std::
  __reverse<__gnu_cxx::__normal_iterator<testing::internal::edit_distance::EditType*,std::vector<testing::internal::edit_distance::EditType,std::allocator<testing::internal::edit_distance::EditType>>>>
            ((__return_storage_ptr__->
             super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (__return_storage_ptr__->
             super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
  ::~vector(&best_move);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&costs);
  return __return_storage_ptr__;
}

Assistant:

std::vector<EditType> CalculateOptimalEdits(const std::vector<size_t>& left,
                                            const std::vector<size_t>& right) {
  std::vector<std::vector<double> > costs(
      left.size() + 1, std::vector<double>(right.size() + 1));
  std::vector<std::vector<EditType> > best_move(
      left.size() + 1, std::vector<EditType>(right.size() + 1));

  // Populate for empty right.
  for (size_t l_i = 0; l_i < costs.size(); ++l_i) {
    costs[l_i][0] = static_cast<double>(l_i);
    best_move[l_i][0] = kRemove;
  }
  // Populate for empty left.
  for (size_t r_i = 1; r_i < costs[0].size(); ++r_i) {
    costs[0][r_i] = static_cast<double>(r_i);
    best_move[0][r_i] = kAdd;
  }

  for (size_t l_i = 0; l_i < left.size(); ++l_i) {
    for (size_t r_i = 0; r_i < right.size(); ++r_i) {
      if (left[l_i] == right[r_i]) {
        // Found a match. Consume it.
        costs[l_i + 1][r_i + 1] = costs[l_i][r_i];
        best_move[l_i + 1][r_i + 1] = kMatch;
        continue;
      }

      const double add = costs[l_i + 1][r_i];
      const double remove = costs[l_i][r_i + 1];
      const double replace = costs[l_i][r_i];
      if (add < remove && add < replace) {
        costs[l_i + 1][r_i + 1] = add + 1;
        best_move[l_i + 1][r_i + 1] = kAdd;
      } else if (remove < add && remove < replace) {
        costs[l_i + 1][r_i + 1] = remove + 1;
        best_move[l_i + 1][r_i + 1] = kRemove;
      } else {
        // We make replace a little more expensive than add/remove to lower
        // their priority.
        costs[l_i + 1][r_i + 1] = replace + 1.00001;
        best_move[l_i + 1][r_i + 1] = kReplace;
      }
    }
  }

  // Reconstruct the best path. We do it in reverse order.
  std::vector<EditType> best_path;
  for (size_t l_i = left.size(), r_i = right.size(); l_i > 0 || r_i > 0;) {
    EditType move = best_move[l_i][r_i];
    best_path.push_back(move);
    l_i -= move != kAdd;
    r_i -= move != kRemove;
  }
  std::reverse(best_path.begin(), best_path.end());
  return best_path;
}